

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall
soul::HEARTGenerator::HEARTGenerator
          (HEARTGenerator *this,ModuleBase *source,Module *targetModule,uint32_t maxDepth)

{
  long *plVar1;
  Function *f;
  Module *pMVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined4 extraout_var;
  string *psVar6;
  Function *pFVar7;
  undefined4 extraout_var_00;
  IdentifierPath *path_00;
  long *plVar8;
  pool_ref<soul::AST::VariableDeclaration> *v;
  Identifier name;
  IdentifierPath path;
  string local_120;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_100;
  string local_a8;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  undefined8 *puVar5;
  
  (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)&PTR__HEARTGenerator_00332b78;
  (this->sourceGraph).object = (Graph *)0x0;
  (this->sourceProcessor).object = (Processor *)0x0;
  this->module = targetModule;
  this->loopIndex = 0;
  this->ifIndex = 0;
  this->parsingStateVariables = false;
  (this->builder).super_BlockBuilder.module = targetModule;
  (this->builder).super_BlockBuilder.currentBlock.object = (Block *)0x0;
  (this->builder).super_BlockBuilder.lastStatementInCurrentBlock.object = (Statement *)0x0;
  (this->builder).super_BlockBuilder._vptr_BlockBuilder =
       (_func_int **)&PTR__FunctionBuilder_00332d78;
  (this->builder).currentFunction.object = (Function *)0x0;
  (this->builder).blockIndex = 0;
  (this->builder).localVarIndex = 0;
  *(undefined8 *)&(this->builder).localVarIndex = 0;
  *(undefined8 *)((long)&(this->currentTargetVariable).object + 4) = 0;
  this->maxExpressionDepth = maxDepth;
  (this->breakTarget).object = (Block *)0x0;
  (this->continueTarget).object = (Block *)0x0;
  (*(source->super_ASTObject)._vptr_ASTObject[0xd])(&local_100);
  local_120._M_dataplus._M_p = (pointer)IdentifierPath::getLastPart((IdentifierPath *)&local_100);
  Identifier::toString_abi_cxx11_((Identifier *)&local_120);
  std::__cxx11::string::_M_assign((string *)&this->module->shortName);
  IdentifierPath::toString_abi_cxx11_(&local_120,(IdentifierPath *)&local_100);
  std::__cxx11::string::operator=((string *)&this->module->fullName,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation(&local_88,&local_100);
  getOriginalModulePath_abi_cxx11_(&local_120,(HEARTGenerator *)&local_88,path_00);
  std::__cxx11::string::operator=((string *)&this->module->originalFullName,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_88);
  iVar4 = (*(source->super_ASTObject)._vptr_ASTObject[0xc])(source);
  puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar4);
  if (puVar5 != (undefined8 *)0x0) {
    plVar1 = (long *)puVar5[1];
    for (plVar8 = (long *)*puVar5; plVar8 != plVar1; plVar8 = plVar8 + 1) {
      f = (Function *)*plVar8;
      if ((f->genericWildcards).
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (f->genericWildcards).
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_120._M_dataplus._M_p = (pointer)getFunctionName(this,f);
        pMVar2 = this->module;
        psVar6 = Identifier::operator_cast_to_string_((Identifier *)&local_120);
        std::__cxx11::string::string((string *)&local_a8,(string *)psVar6);
        pFVar7 = Module::Functions::add(&pMVar2->functions,&local_a8,false);
        std::__cxx11::string::~string((string *)&local_a8);
        *(Function **)(*plVar8 + 0xd8) = pFVar7;
      }
    }
  }
  iVar4 = (*(source->super_ASTObject)._vptr_ASTObject[0xb])();
  puVar3 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1];
  for (puVar5 = *(undefined8 **)CONCAT44(extraout_var_00,iVar4); puVar5 != puVar3;
      puVar5 = puVar5 + 1) {
    if (((VariableDeclaration *)*puVar5)->isExternal == true) {
      addExternalVariable(this,(VariableDeclaration *)*puVar5);
    }
  }
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_100);
  return;
}

Assistant:

HEARTGenerator (AST::ModuleBase& source, Module& targetModule, uint32_t maxDepth)
        : module (targetModule), builder (targetModule), maxExpressionDepth (maxDepth)
    {
        auto path = source.getFullyQualifiedPath();
        module.shortName = path.getLastPart().toString();
        module.fullName = path.toString();
        module.originalFullName = getOriginalModulePath (path);

        if (auto fns = source.getFunctionList())
        {
            for (auto& f : *fns)
            {
                if (! f->isGeneric())
                {
                    auto name = getFunctionName (f);
                    auto& af = module.functions.add (name, false);
                    f->generatedFunction = af;
                }
            }
        }

        auto& vars = source.getStateVariableList();

        for (auto& v : vars)
            if (v->isExternal)
                addExternalVariable (v);
    }